

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_12400a::MMIFStream::MMIFStream(MMIFStream *this,char *fileName)

{
  int iVar1;
  char *pcVar2;
  IoExc *pIVar3;
  stat s;
  
  Imf_3_2::IStream::IStream(&this->super_IStream,fileName);
  *(undefined ***)this = &PTR__MMIFStream_001d41f8;
  this->_f = -1;
  this->_mmap = (void *)0xffffffffffffffff;
  this->_mmapStart = (char *)0x0;
  this->_pos = 0;
  this->_length = 0;
  iVar1 = open(fileName,0);
  this->_f = iVar1;
  if (iVar1 == -1) {
    pIVar3 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::IoExc::IoExc(pIVar3,"Cannot open file.");
    __cxa_throw(pIVar3,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
  }
  memset(&s,0,0x90);
  iVar1 = stat(fileName,(stat *)&s);
  if (iVar1 == 0) {
    this->_length = s.st_size;
    pcVar2 = (char *)mmap((void *)0x0,s.st_size,1,1,this->_f,0);
    this->_mmap = pcVar2;
    if (pcVar2 != (char *)0xffffffffffffffff) {
      this->_mmapStart = pcVar2;
      return;
    }
    pIVar3 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::IoExc::IoExc(pIVar3,"Cannot memory map file.");
  }
  else {
    pIVar3 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::IoExc::IoExc(pIVar3,"Cannot stat file.");
  }
  __cxa_throw(pIVar3,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
}

Assistant:

MMIFStream::MMIFStream (const char fileName[])
    : OPENEXR_IMF_NAMESPACE::IStream (fileName)
#ifdef _WIN32
    , _f (INVALID_HANDLE_VALUE)
#else
    , _f (-1)
#endif
    , _mmap (reinterpret_cast<void*>(-1))
    , _mmapStart (nullptr)
    , _pos (0)
    , _length (0)
{
#ifdef _WIN32
    const std::wstring fileNameWide = WidenFilename (fileName);
    try
    {
        _f = CreateFileW (
            fileNameWide.c_str (),
            GENERIC_READ,
            FILE_SHARE_READ,
            0,
            OPEN_EXISTING,
            FILE_ATTRIBUTE_NORMAL,
            0);
    }
    catch (const std::exception&)
    {
        _f = INVALID_HANDLE_VALUE;
    }
    if (INVALID_HANDLE_VALUE == _f)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot open file.");
    }

    struct _stati64 s;
    memset (&s, 0, sizeof (struct _stati64));
    if (_wstati64 (fileNameWide.c_str (), &s) != 0)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot stat file.");
    }

    _length = s.st_size;

    _mmap = CreateFileMapping (_f, 0, PAGE_READONLY, 0, 0, 0);
    if (!_mmap)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot memory map file.");
    }

    _mmapStart = reinterpret_cast<const char*> (
        MapViewOfFile (_mmap, FILE_MAP_READ, 0, 0, 0));
    if (!_mmapStart)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot map view of file.");
    }

#else

    _f = open(fileName, O_RDONLY);
    if (-1 == _f)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot open file.");
    }

    struct stat s;
    memset(&s, 0, sizeof(struct stat));
    if (stat(fileName, &s) != 0)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot stat file.");
    }

    _length = s.st_size;

    _mmap = mmap(0, _length, PROT_READ, MAP_SHARED, _f, 0);
    if (_mmap == (void*)-1)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot memory map file.");
    }

    _mmapStart = reinterpret_cast<char*> (_mmap);
#endif
}